

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeDropTable(Btree *p,Pgno iTable,int *piMoved)

{
  long lVar1;
  Pgno PVar2;
  BtShared *in_RDX;
  uint in_ESI;
  BtShared *in_RDI;
  long in_FS_OFFSET;
  BtShared *pBt;
  MemPage *pMove;
  Pgno maxRootPgno;
  MemPage *pPage;
  int rc;
  int *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  u32 in_stack_ffffffffffffffa8;
  sqlite3 *pBt_00;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar3;
  int local_2c;
  Pgno local_1c;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pBt_00 = in_RDI->db;
  uVar3 = in_ESI;
  PVar2 = btreePagecount((BtShared *)pBt_00);
  if (PVar2 < in_ESI) {
    local_2c = sqlite3CorruptError(0);
  }
  else {
    local_2c = sqlite3BtreeClearTable
                         ((Btree *)pBt_00,in_ESI,
                          (i64 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (local_2c == 0) {
      local_2c = btreeGetPage(in_RDX,(Pgno)((ulong)pBt_00 >> 0x20),
                              (MemPage **)CONCAT44(in_ESI,in_stack_ffffffffffffffa8),
                              in_stack_ffffffffffffffa4);
      if (local_2c == 0) {
        *(undefined4 *)&in_RDX->pPager = 0;
        if (*(u8 *)((long)&pBt_00->aDb + 1) == '\0') {
          freePage((MemPage *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff98);
          releasePage((MemPage *)0x19c732);
          local_c = local_2c;
        }
        else {
          sqlite3BtreeGetMeta((Btree *)pBt_00,in_ESI,
                              (u32 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
          if (uVar3 == 0xaaaaaaaa) {
            freePage((MemPage *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
            releasePage((MemPage *)0x19c5a8);
          }
          else {
            releasePage((MemPage *)0x19c5da);
            local_2c = btreeGetPage(in_RDX,(Pgno)((ulong)pBt_00 >> 0x20),
                                    (MemPage **)CONCAT44(in_ESI,in_stack_ffffffffffffffa8),
                                    in_stack_ffffffffffffffa4);
            if (local_2c != 0) goto LAB_0019c73a;
            local_2c = relocatePage(in_RDI,(MemPage *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                                    (u8)((ulong)in_RDX >> 0x38),(Pgno)in_RDX,
                                    (Pgno)((ulong)pBt_00 >> 0x20),(int)pBt_00);
            releasePage((MemPage *)0x19c634);
            if (local_2c != 0) goto LAB_0019c73a;
            local_2c = btreeGetPage(in_RDX,(Pgno)((ulong)pBt_00 >> 0x20),
                                    (MemPage **)CONCAT44(in_ESI,in_stack_ffffffffffffffa8),
                                    in_stack_ffffffffffffffa4);
            freePage((MemPage *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
            releasePage((MemPage *)0x19c683);
            if (local_2c != 0) goto LAB_0019c73a;
            *(undefined4 *)&in_RDX->pPager = 0xaaaaaaaa;
          }
          local_1c = 0xaaaaaaa9;
          while( true ) {
            in_stack_ffffffffffffffa8 = CONCAT13(1,(int3)in_stack_ffffffffffffffa8);
            if (local_1c != (uint)sqlite3PendingByte / *(u32 *)((long)&pBt_00->flags + 4) + 1) {
              PVar2 = ptrmapPageno((BtShared *)pBt_00,local_1c);
              in_stack_ffffffffffffffa8 =
                   CONCAT13(PVar2 == local_1c,(int3)in_stack_ffffffffffffffa8);
            }
            if ((char)(in_stack_ffffffffffffffa8 >> 0x18) == '\0') break;
            local_1c = local_1c - 1;
          }
          local_c = sqlite3BtreeUpdateMeta((Btree *)pBt_00,in_ESI,in_stack_ffffffffffffffa8);
        }
        local_2c = local_c;
      }
      else {
        releasePage((MemPage *)0x19c542);
      }
    }
  }
LAB_0019c73a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

static int btreeDropTable(Btree *p, Pgno iTable, int *piMoved){
  int rc;
  MemPage *pPage = 0;
  BtShared *pBt = p->pBt;

  assert( sqlite3BtreeHoldsMutex(p) );
  assert( p->inTrans==TRANS_WRITE );
  assert( iTable>=2 );
  if( iTable>btreePagecount(pBt) ){
    return SQLITE_CORRUPT_PGNO(iTable);
  }

  rc = sqlite3BtreeClearTable(p, iTable, 0);
  if( rc ) return rc;
  rc = btreeGetPage(pBt, (Pgno)iTable, &pPage, 0);
  if( NEVER(rc) ){
    releasePage(pPage);
    return rc;
  }

  *piMoved = 0;

#ifdef SQLITE_OMIT_AUTOVACUUM
  freePage(pPage, &rc);
  releasePage(pPage);
#else
  if( pBt->autoVacuum ){
    Pgno maxRootPgno;
    sqlite3BtreeGetMeta(p, BTREE_LARGEST_ROOT_PAGE, &maxRootPgno);

    if( iTable==maxRootPgno ){
      /* If the table being dropped is the table with the largest root-page
      ** number in the database, put the root page on the free list.
      */
      freePage(pPage, &rc);
      releasePage(pPage);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }else{
      /* The table being dropped does not have the largest root-page
      ** number in the database. So move the page that does into the
      ** gap left by the deleted root-page.
      */
      MemPage *pMove;
      releasePage(pPage);
      rc = btreeGetPage(pBt, maxRootPgno, &pMove, 0);
      if( rc!=SQLITE_OK ){
        return rc;
      }
      rc = relocatePage(pBt, pMove, PTRMAP_ROOTPAGE, 0, iTable, 0);
      releasePage(pMove);
      if( rc!=SQLITE_OK ){
        return rc;
      }
      pMove = 0;
      rc = btreeGetPage(pBt, maxRootPgno, &pMove, 0);
      freePage(pMove, &rc);
      releasePage(pMove);
      if( rc!=SQLITE_OK ){
        return rc;
      }
      *piMoved = maxRootPgno;
    }

    /* Set the new 'max-root-page' value in the database header. This
    ** is the old value less one, less one more if that happens to
    ** be a root-page number, less one again if that is the
    ** PENDING_BYTE_PAGE.
    */
    maxRootPgno--;
    while( maxRootPgno==PENDING_BYTE_PAGE(pBt)
           || PTRMAP_ISPAGE(pBt, maxRootPgno) ){
      maxRootPgno--;
    }
    assert( maxRootPgno!=PENDING_BYTE_PAGE(pBt) );

    rc = sqlite3BtreeUpdateMeta(p, 4, maxRootPgno);
  }else{
    freePage(pPage, &rc);
    releasePage(pPage);
  }
#endif
  return rc;
}